

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  bool bVar1;
  const_reference pvVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar5;
  void *src;
  size_t size;
  const_pointer src_00;
  size_type size_00;
  bool bVar6;
  undefined1 local_48 [8];
  string valid_str;
  bool has_invalid_chars;
  NextChar next_char_local;
  WatWriter *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (WatWriter *)str._M_len;
  valid_str.field_2._12_4_ = next_char;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  bVar6 = false;
  if (!bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    bVar6 = *pvVar2 == '$';
  }
  if (!bVar6) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                  ,0x13d,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(std::string_view, NextChar)"
                 );
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  valid_str.field_2._M_local_buf[0xb] =
       std::
       any_of<char_const*,wabt::(anonymous_namespace)::WatWriter::WriteName(std::basic_string_view<char,std::char_traits<char>>,wabt::(anonymous_namespace)::NextChar)::__0>
                 (pvVar3,pvVar4);
  if ((bool)valid_str.field_2._M_local_buf[0xb]) {
    std::__cxx11::string::string((string *)local_48);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    bVar5 = std::back_inserter<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    std::
    transform<char_const*,std::back_insert_iterator<std::__cxx11::string>,wabt::(anonymous_namespace)::WatWriter::WriteName(std::basic_string_view<char,std::char_traits<char>>,wabt::(anonymous_namespace)::NextChar)::__1>
              (pvVar3,pvVar4,bVar5.container);
    src = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::length();
    WriteDataWithNextChar(this,src,size);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    src_00 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    size_00 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    WriteDataWithNextChar(this,src_00,size_00);
  }
  this->next_char_ = valid_str.field_2._12_4_;
  return;
}

Assistant:

void WatWriter::WriteName(std::string_view str, NextChar next_char) {
  // Debug names must begin with a $ for for wast file to be valid
  assert(!str.empty() && str.front() == '$');
  bool has_invalid_chars = std::any_of(
      str.begin(), str.end(), [](uint8_t c) { return !s_valid_name_chars[c]; });

  if (has_invalid_chars) {
    std::string valid_str;
    std::transform(str.begin(), str.end(), std::back_inserter(valid_str),
                   [](uint8_t c) { return s_valid_name_chars[c] ? c : '_'; });
    WriteDataWithNextChar(valid_str.data(), valid_str.length());
  } else {
    WriteDataWithNextChar(str.data(), str.length());
  }

  next_char_ = next_char;
}